

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O0

UModelIndex * __thiscall
TreeModel::findLastParentOfType
          (UModelIndex *__return_storage_ptr__,TreeModel *this,UModelIndex *index,UINT8 type)

{
  bool bVar1;
  TreeModel *local_68;
  uint64_t local_60;
  TreeModel *local_58;
  TreeModel *local_50;
  UModelIndex currentParentOfType;
  UModelIndex lastParentOfType;
  UINT8 type_local;
  UModelIndex *index_local;
  TreeModel *this_local;
  
  bVar1 = UModelIndex::isValid(index);
  if (bVar1) {
    findParentOfType((UModelIndex *)&currentParentOfType.m,this,index,type);
    bVar1 = UModelIndex::isValid((UModelIndex *)&currentParentOfType.m);
    if (bVar1) {
      findParentOfType((UModelIndex *)&local_50,this,(UModelIndex *)&currentParentOfType.m,type);
      while( true ) {
        bVar1 = UModelIndex::isValid((UModelIndex *)&local_50);
        if (!bVar1) break;
        currentParentOfType.m = local_50;
        lastParentOfType.r = currentParentOfType.r;
        lastParentOfType.c = currentParentOfType.c;
        lastParentOfType.i = currentParentOfType.i;
        findParentOfType((UModelIndex *)&local_68,this,(UModelIndex *)&currentParentOfType.m,type);
        local_50 = local_68;
        currentParentOfType._0_8_ = local_60;
        currentParentOfType.i = (uint64_t)local_58;
      }
      *(TreeModel **)__return_storage_ptr__ = currentParentOfType.m;
      __return_storage_ptr__->i = lastParentOfType._0_8_;
      __return_storage_ptr__->m = (TreeModel *)lastParentOfType.i;
    }
    else {
      UModelIndex::UModelIndex(__return_storage_ptr__);
    }
  }
  else {
    UModelIndex::UModelIndex(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

UModelIndex TreeModel::findLastParentOfType(const UModelIndex& index, UINT8 type) const
{
    if (!index.isValid())
        return UModelIndex();
    
    UModelIndex lastParentOfType = findParentOfType(index, type);
    
    if (!lastParentOfType.isValid())
        return UModelIndex();
    
    UModelIndex currentParentOfType = findParentOfType(lastParentOfType, type);
    while (currentParentOfType.isValid()) {
        lastParentOfType = currentParentOfType;
        currentParentOfType = findParentOfType(lastParentOfType, type);
    }
    
    return lastParentOfType;
}